

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

void __thiscall wasm::ThreadPool::notifyThreadIsReady(ThreadPool *this)

{
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> lock;
  ThreadPool *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_40,(mutex_type *)threadMutex);
  LOCK();
  (this->ready).super___atomic_base<unsigned_long>._M_i =
       (this->ready).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  return;
}

Assistant:

void ThreadPool::notifyThreadIsReady() {
  DEBUG_POOL("notify thread is ready\n";)
  std::lock_guard<std::mutex> lock(threadMutex);
  ready.fetch_add(1);
  condition.notify_one();
}